

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O0

void __thiscall
dg::vr::ValueRelations::RelatedValueIterator::nextViableValue(RelatedValueIterator *this)

{
  bool bVar1;
  RelatedValueIterator *this_00;
  long in_RDI;
  map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  *in_stack_ffffffffffffffc8;
  const_iterator in_stack_ffffffffffffffe0;
  _Self local_18;
  Value **local_10;
  
  while( true ) {
    this_00 = (RelatedValueIterator *)(in_RDI + 0x40);
    getCurrentEqual(this_00);
    local_10 = (Value **)
               VectorSet<const_llvm::Value_*>::end
                         ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)this_00,
                       (__normal_iterator<const_llvm::Value_*const_*,_std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      updateCurrent((RelatedValueIterator *)in_stack_ffffffffffffffe0._M_current);
      return;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>
                  *)this_00);
    in_stack_ffffffffffffffc8 =
         (map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
          *)(in_RDI + 0x38);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
         ::end(in_stack_ffffffffffffffc8);
    bVar1 = std::operator==((_Self *)in_stack_ffffffffffffffc8,&local_18);
    if (bVar1) break;
    getCurrentEqual(this_00);
    in_stack_ffffffffffffffe0 =
         VectorSet<const_llvm::Value_*>::begin
                   ((VectorSet<const_llvm::Value_*> *)in_stack_ffffffffffffffc8);
    *(Value ***)(in_RDI + 0x40) = in_stack_ffffffffffffffe0._M_current;
  }
  *(undefined1 *)(in_RDI + 0x58) = 1;
  return;
}

Assistant:

void nextViableValue() {
            while (valueIt == getCurrentEqual().end()) {
                ++bucketIt;
                if (bucketIt == related.end()) {
                    isEnd = true;
                    return;
                }
                valueIt = getCurrentEqual().begin();
            }
            updateCurrent();
        }